

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O0

PCMTrack * __thiscall Storage::Disk::PCMTrack::resampled_clone(PCMTrack *this,size_t bits_per_track)

{
  bool bVar1;
  PCMTrack *this_00;
  Time local_68;
  PCMSegment *local_60;
  PCMSegment *source;
  PCMSegmentEventSource *event_source;
  iterator __end1;
  iterator __begin1;
  vector<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  *__range1;
  Time start_time;
  PCMTrack *new_track;
  size_t bits_per_track_local;
  PCMTrack *this_local;
  
  this_00 = (PCMTrack *)operator_new(0x30);
  new_track._0_4_ = (uint)bits_per_track;
  PCMTrack(this_00,(uint)new_track);
  Time::Time((Time *)((long)&__range1 + 4));
  __end1 = std::
           vector<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
           ::begin(&this->segment_event_sources_);
  event_source = (PCMSegmentEventSource *)
                 std::
                 vector<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
                 ::end(&this->segment_event_sources_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Storage::Disk::PCMSegmentEventSource_*,_std::vector<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>_>
                                *)&event_source);
    if (!bVar1) break;
    source = (PCMSegment *)
             __gnu_cxx::
             __normal_iterator<Storage::Disk::PCMSegmentEventSource_*,_std::vector<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>_>
             ::operator*(&__end1);
    local_60 = PCMSegmentEventSource::segment((PCMSegmentEventSource *)source);
    add_segment(this_00,(Time *)((long)&__range1 + 4),local_60,true);
    local_68 = PCMSegment::length(local_60);
    Time::operator+=((Time *)((long)&__range1 + 4),&local_68);
    __gnu_cxx::
    __normal_iterator<Storage::Disk::PCMSegmentEventSource_*,_std::vector<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>_>
    ::operator++(&__end1);
  }
  this_00->is_resampled_clone_ = true;
  return this_00;
}

Assistant:

PCMTrack *PCMTrack::resampled_clone(size_t bits_per_track) {
	// Create an empty track.
	PCMTrack *const new_track = new PCMTrack(unsigned(bits_per_track));

	// Plot all segments from this track onto the destination.
	Time start_time;
	for(const auto &event_source: segment_event_sources_) {
		const PCMSegment &source = event_source.segment();
		new_track->add_segment(start_time, source, true);
		start_time += source.length();
	}

	new_track->is_resampled_clone_ = true;
	return new_track;
}